

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

void __thiscall FParser::SF_PlayerAddFrag(FParser *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int playernum2;
  int playernum1;
  FParser *this_local;
  
  bVar1 = CheckArgs(this,1);
  if (bVar1) {
    if (this->t_argc == 1) {
      iVar2 = T_GetPlayerNum(this->t_argv);
      *(int *)(&DAT_01ae7184 + (long)iVar2 * 0x2a0) =
           *(int *)(&DAT_01ae7184 + (long)iVar2 * 0x2a0) + 1;
      (this->t_return).type = 1;
      (this->t_return).value.i = *(int *)(&DAT_01ae7184 + (long)iVar2 * 0x2a0);
    }
    else {
      iVar2 = T_GetPlayerNum(this->t_argv);
      iVar3 = T_GetPlayerNum(this->t_argv + 1);
      *(int *)(&DAT_01ae7164 + (long)iVar3 * 4 + (long)iVar2 * 0x2a0) =
           *(int *)(&DAT_01ae7164 + (long)iVar3 * 4 + (long)iVar2 * 0x2a0) + 1;
      (this->t_return).type = 1;
      (this->t_return).value.i = *(int *)(&DAT_01ae7164 + (long)iVar3 * 4 + (long)iVar2 * 0x2a0);
    }
  }
  return;
}

Assistant:

void FParser::SF_PlayerAddFrag()
{
	int playernum1;
	int playernum2;

	if (CheckArgs(1))
	{
		if (t_argc == 1)
		{
			playernum1 = T_GetPlayerNum(t_argv[0]);

			players[playernum1].fragcount++;

			t_return.type = svt_int;
			t_return.value.f = players[playernum1].fragcount;
		}

		else
		{
			playernum1 = T_GetPlayerNum(t_argv[0]);
			playernum2 = T_GetPlayerNum(t_argv[1]);

			players[playernum1].frags[playernum2]++;

			t_return.type = svt_int;
			t_return.value.f = players[playernum1].frags[playernum2];
		}
	}
}